

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_set_camera3d_mode(rf_camera3d_state *state,rf_camera3d camera,rf_builtin_camera3d_mode mode)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = camera.target.x - camera.position.x;
  fVar4 = camera.target.y - camera.position.y;
  fVar3 = fVar4 * fVar4 + fVar1 * fVar1;
  fVar2 = (camera.target.z - camera.position.z) * (camera.target.z - camera.position.z);
  state->camera_target_distance = SQRT(fVar2 + fVar3);
  fVar1 = asinf(ABS(fVar1) / SQRT(fVar1 * fVar1 + fVar2));
  (state->camera_angle).x = fVar1;
  fVar1 = asinf(ABS(fVar4) / SQRT(fVar3));
  (state->camera_angle).y = -fVar1;
  state->player_eyes_position = camera.position.y;
  state->camera_mode = mode;
  return;
}

Assistant:

RF_API void rf_set_camera3d_mode(rf_camera3d_state* state, rf_camera3d camera, rf_builtin_camera3d_mode mode)
{
    rf_vec3 v1 = camera.position;
    rf_vec3 v2 = camera.target;

    float dx = v2.x - v1.x;
    float dy = v2.y - v1.y;
    float dz = v2.z - v1.z;

    state->camera_target_distance = sqrtf(dx*dx + dy*dy + dz*dz);

    rf_vec2 distance = { 0.0f, 0.0f };
    distance.x = sqrtf(dx*dx + dz*dz);
    distance.y = sqrtf(dx*dx + dy*dy);

    // rf_camera3d angle calculation
    state->camera_angle.x = asinf((float)fabs(dx)/distance.x); // rf_camera3d angle in plane XZ (0 aligned with Z, move positive CCW)
    state->camera_angle.y = -asinf((float)fabs(dy)/distance.y); // rf_camera3d angle in plane XY (0 aligned with X, move positive CW)

    state->player_eyes_position = camera.position.y;

    // Lock cursor for first person and third person cameras
    // if ((mode == rf_camera_first_person) || (mode == rf_camera_third_person)) DisableCursor();
    // else EnableCursor();

    state->camera_mode = mode;
}